

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

int cm_zlib_compress2(Bytef *dest,uLongf *destLen,Bytef *source,uLong sourceLen,int level)

{
  int local_b0;
  undefined1 auStack_a8 [4];
  int err;
  z_stream stream;
  int level_local;
  uLong sourceLen_local;
  Bytef *source_local;
  uLongf *destLen_local;
  Bytef *dest_local;
  
  stream.next_in._0_4_ = (undefined4)sourceLen;
  stream.next_out._0_4_ = (undefined4)*destLen;
  if ((*destLen & 0xffffffff) == *destLen) {
    stream.state = (internal_state *)0x0;
    stream.zalloc = (alloc_func)0x0;
    stream.zfree = (free_func)0x0;
    _auStack_a8 = source;
    stream.total_in = (uLong)dest;
    stream.reserved._4_4_ = level;
    dest_local._4_4_ = cm_zlib_deflateInit_((z_streamp)auStack_a8,level,"1.2.3",0x70);
    if (dest_local._4_4_ == 0) {
      local_b0 = cm_zlib_deflate((z_streamp)auStack_a8,4);
      if (local_b0 == 1) {
        *destLen = stream._32_8_;
        dest_local._4_4_ = cm_zlib_deflateEnd((z_streamp)auStack_a8);
      }
      else {
        cm_zlib_deflateEnd((z_streamp)auStack_a8);
        if (local_b0 == 0) {
          local_b0 = -5;
        }
        dest_local._4_4_ = local_b0;
      }
    }
  }
  else {
    dest_local._4_4_ = -5;
  }
  return dest_local._4_4_;
}

Assistant:

int ZEXPORT compress2 (dest, destLen, source, sourceLen, level)
    Bytef *dest;
    uLongf *destLen;
    const Bytef *source;
    uLong sourceLen;
    int level;
{
    z_stream stream;
    int err;

    stream.next_in = (Bytef*)source;
    stream.avail_in = (uInt)sourceLen;
#ifdef MAXSEG_64K
    /* Check for source > 64K on 16-bit machine: */
    if ((uLong)stream.avail_in != sourceLen) return Z_BUF_ERROR;
#endif
    stream.next_out = dest;
    stream.avail_out = (uInt)*destLen;
    if ((uLong)stream.avail_out != *destLen) return Z_BUF_ERROR;

    stream.zalloc = (alloc_func)0;
    stream.zfree = (free_func)0;
    stream.opaque = (voidpf)0;

    err = deflateInit(&stream, level);
    if (err != Z_OK) return err;

    err = deflate(&stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        deflateEnd(&stream);
        return err == Z_OK ? Z_BUF_ERROR : err;
    }
    *destLen = stream.total_out;

    err = deflateEnd(&stream);
    return err;
}